

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind6-error.c
# Opt level: O2

int run_test_tcp_bind6_error_fault(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_150;
  char garbage [60];
  uv_tcp_t server;
  
  builtin_strncpy(garbage + 0x30,"h blah blah",0xc);
  builtin_strncpy(garbage + 0x20,"ah blah blah bla",0x10);
  builtin_strncpy(garbage + 0x10,"lah blah blah bl",0x10);
  builtin_strncpy(garbage,"blah blah blah b",0x10);
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    fprintf(_stderr,"%s\n","IPv6 not supported");
    fflush(_stderr);
    return 1;
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar2,&server);
  if (iVar1 == 0) {
    iVar1 = uv_tcp_bind(&server,(sockaddr *)garbage,0);
    if (iVar1 == -0x16) {
      uv_close((uv_handle_t *)&server,close_cb);
      puVar2 = uv_default_loop();
      uv_run(puVar2,UV_RUN_DEFAULT);
      if (close_cb_called == 1) {
        puVar2 = uv_default_loop();
        close_loop(puVar2);
        puVar2 = uv_default_loop();
        iVar1 = uv_loop_close(puVar2);
        if (iVar1 == 0) {
          return 0;
        }
        pcVar3 = "0 == uv_loop_close(uv_default_loop())";
        uStack_150 = 0x7b;
      }
      else {
        pcVar3 = "close_cb_called == 1";
        uStack_150 = 0x79;
      }
    }
    else {
      pcVar3 = "r == UV_EINVAL";
      uStack_150 = 0x73;
    }
  }
  else {
    pcVar3 = "r == 0";
    uStack_150 = 0x71;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind6-error.c"
          ,uStack_150,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_bind6_error_fault) {
  char garbage[] =
      "blah blah blah blah blah blah blah blah blah blah blah blah";
  struct sockaddr_in6* garbage_addr;
  uv_tcp_t server;
  int r;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  garbage_addr = (struct sockaddr_in6*) &garbage;

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server, (const struct sockaddr*) garbage_addr, 0);
  ASSERT(r == UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}